

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O1

void Gudhi::persistence_matrix::swap
               (Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                *matrix1,
               Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
               *matrix2)

{
  int iVar1;
  Index IVar2;
  pointer puVar3;
  Column_settings *pCVar4;
  pointer puVar5;
  pointer puVar6;
  
  iVar1 = (matrix1->super_Matrix_dimension_option).maxDim_;
  (matrix1->super_Matrix_dimension_option).maxDim_ =
       (matrix2->super_Matrix_dimension_option).maxDim_;
  (matrix2->super_Matrix_dimension_option).maxDim_ = iVar1;
  puVar5 = (matrix1->super_Matrix_dimension_option).dimensions_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (matrix1->super_Matrix_dimension_option).dimensions_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (matrix1->super_Matrix_dimension_option).dimensions_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (matrix1->super_Matrix_dimension_option).dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (matrix2->super_Matrix_dimension_option).dimensions_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  (matrix1->super_Matrix_dimension_option).dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (matrix2->super_Matrix_dimension_option).dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (matrix1->super_Matrix_dimension_option).dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (matrix2->super_Matrix_dimension_option).dimensions_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (matrix2->super_Matrix_dimension_option).dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar5;
  (matrix2->super_Matrix_dimension_option).dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar6;
  (matrix2->super_Matrix_dimension_option).dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar3;
  swap(&matrix1->super_Base_pairing_option,&matrix2->super_Base_pairing_option);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::swap(&(matrix1->matrix_)._M_h,&(matrix2->matrix_)._M_h);
  IVar2 = matrix1->nextInsertIndex_;
  matrix1->nextInsertIndex_ = matrix2->nextInsertIndex_;
  matrix2->nextInsertIndex_ = IVar2;
  pCVar4 = matrix1->colSettings_;
  matrix1->colSettings_ = matrix2->colSettings_;
  matrix2->colSettings_ = pCVar4;
  return;
}

Assistant:

void swap(Boundary_matrix& matrix1, Boundary_matrix& matrix2) {
    swap(static_cast<typename Master_matrix::Matrix_dimension_option&>(matrix1),
         static_cast<typename Master_matrix::Matrix_dimension_option&>(matrix2));
    swap(static_cast<typename Master_matrix::template Base_swap_option<Boundary_matrix<Master_matrix> >&>(matrix1),
         static_cast<typename Master_matrix::template Base_swap_option<Boundary_matrix<Master_matrix> >&>(matrix2));
    swap(static_cast<typename Master_matrix::Base_pairing_option&>(matrix1),
         static_cast<typename Master_matrix::Base_pairing_option&>(matrix2));
    matrix1.matrix_.swap(matrix2.matrix_);
    std::swap(matrix1.nextInsertIndex_, matrix2.nextInsertIndex_);
    std::swap(matrix1.colSettings_, matrix2.colSettings_);

    if constexpr (Master_matrix::Option_list::has_row_access) {
      swap(static_cast<typename Master_matrix::Matrix_row_access_option&>(matrix1),
           static_cast<typename Master_matrix::Matrix_row_access_option&>(matrix2));
    }
  }